

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.c
# Opt level: O3

float deRandom_getFloat(deRandom *rnd)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = rnd->w;
  uVar1 = rnd->x << 0xb ^ rnd->x;
  rnd->x = rnd->y;
  rnd->y = rnd->z;
  rnd->z = uVar2;
  uVar2 = uVar1 >> 8 ^ uVar2 >> 0x13 ^ uVar2 ^ uVar1;
  rnd->w = uVar2;
  return (float)(uVar2 & 0xfffffff) * 3.7252903e-09;
}

Assistant:

deUint32 deRandom_getUint32 (deRandom* rnd)
{
	deUint32 w = rnd->w;
	deUint32 t;

	t = rnd->x ^ (rnd->x << 11);
	rnd->x = rnd->y;
	rnd->y = rnd->z;
	rnd->z = w;
	rnd->w = w = (w ^ (w >> 19)) ^ (t ^ (t >> 8));
	return w;
}